

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastVehicle.cpp
# Opt level: O1

void __thiscall
btRaycastVehicle::updateWheelTransformsWS
          (btRaycastVehicle *this,btWheelInfo *wheel,bool interpolatedTransform)

{
  float fVar1;
  float fVar2;
  float fVar3;
  btRigidBody *pbVar4;
  btMotionState *pbVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined3 in_register_00000011;
  btTransform chassisTrans;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  btScalar local_18;
  btScalar bStack_14;
  btScalar bStack_10;
  btScalar bStack_c;
  
  (wheel->m_raycastInfo).m_isInContact = false;
  pbVar4 = this->m_chassisBody;
  local_48 = *(undefined8 *)
              (pbVar4->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats;
  uStack_40 = *(undefined8 *)
               ((pbVar4->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats + 2);
  local_38 = *(undefined8 *)
              (pbVar4->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats;
  uStack_30 = *(undefined8 *)
               ((pbVar4->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats + 2);
  local_28 = *(undefined8 *)
              (pbVar4->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats;
  uStack_20 = *(undefined8 *)
               ((pbVar4->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats + 2);
  local_18 = (pbVar4->super_btCollisionObject).m_worldTransform.m_origin.m_floats[0];
  bStack_14 = (pbVar4->super_btCollisionObject).m_worldTransform.m_origin.m_floats[1];
  bStack_10 = (pbVar4->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
  bStack_c = (pbVar4->super_btCollisionObject).m_worldTransform.m_origin.m_floats[3];
  if ((CONCAT31(in_register_00000011,interpolatedTransform) != 0) &&
     (pbVar5 = pbVar4->m_optionalMotionState, pbVar5 != (btMotionState *)0x0)) {
    (*pbVar5->_vptr_btMotionState[2])(pbVar5,&local_48);
  }
  fVar1 = (wheel->m_chassisConnectionPointCS).m_floats[0];
  fVar2 = (wheel->m_chassisConnectionPointCS).m_floats[1];
  fVar3 = (wheel->m_chassisConnectionPointCS).m_floats[2];
  auVar6._4_4_ = bStack_14 +
                 fVar3 * (float)uStack_30 + fVar1 * (float)local_38 + fVar2 * local_38._4_4_;
  auVar6._0_4_ = local_18 +
                 fVar3 * (float)uStack_40 + fVar1 * (float)local_48 + fVar2 * local_48._4_4_;
  auVar6._8_4_ = fVar3 * (float)uStack_20 + fVar1 * (float)local_28 + fVar2 * local_28._4_4_ +
                 bStack_10;
  auVar6._12_4_ = 0;
  *(undefined1 (*) [16])(wheel->m_raycastInfo).m_hardPointWS.m_floats = auVar6;
  fVar1 = (wheel->m_wheelDirectionCS).m_floats[0];
  fVar2 = (wheel->m_wheelDirectionCS).m_floats[1];
  fVar3 = (wheel->m_wheelDirectionCS).m_floats[2];
  auVar7._4_4_ = fVar3 * (float)uStack_30 + fVar1 * (float)local_38 + fVar2 * local_38._4_4_;
  auVar7._0_4_ = fVar3 * (float)uStack_40 + fVar1 * (float)local_48 + fVar2 * local_48._4_4_;
  auVar7._8_4_ = (float)local_28 * fVar1 + local_28._4_4_ * fVar2 + (float)uStack_20 * fVar3;
  auVar7._12_4_ = 0;
  *(undefined1 (*) [16])(wheel->m_raycastInfo).m_wheelDirectionWS.m_floats = auVar7;
  fVar1 = (wheel->m_wheelAxleCS).m_floats[0];
  fVar2 = (wheel->m_wheelAxleCS).m_floats[1];
  fVar3 = (wheel->m_wheelAxleCS).m_floats[2];
  auVar8._4_4_ = fVar3 * (float)uStack_30 + fVar1 * (float)local_38 + fVar2 * local_38._4_4_;
  auVar8._0_4_ = fVar3 * (float)uStack_40 + fVar1 * (float)local_48 + fVar2 * local_48._4_4_;
  auVar8._8_4_ = (float)local_28 * fVar1 + local_28._4_4_ * fVar2 + (float)uStack_20 * fVar3;
  auVar8._12_4_ = 0;
  *(undefined1 (*) [16])(wheel->m_raycastInfo).m_wheelAxleWS.m_floats = auVar8;
  return;
}

Assistant:

void	btRaycastVehicle::updateWheelTransformsWS(btWheelInfo& wheel , bool interpolatedTransform)
{
	wheel.m_raycastInfo.m_isInContact = false;

	btTransform chassisTrans = getChassisWorldTransform();
	if (interpolatedTransform && (getRigidBody()->getMotionState()))
	{
		getRigidBody()->getMotionState()->getWorldTransform(chassisTrans);
	}

	wheel.m_raycastInfo.m_hardPointWS = chassisTrans( wheel.m_chassisConnectionPointCS );
	wheel.m_raycastInfo.m_wheelDirectionWS = chassisTrans.getBasis() *  wheel.m_wheelDirectionCS ;
	wheel.m_raycastInfo.m_wheelAxleWS = chassisTrans.getBasis() * wheel.m_wheelAxleCS;
}